

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O2

void __thiscall
libtorrent::session_handle::
async_call<void(libtorrent::aux::session_impl::*)(libtorrent::aux::strong_typedef<int,libtorrent::port_mapping_tag,void>),libtorrent::aux::strong_typedef<int,libtorrent::port_mapping_tag,void>&>
          (session_handle *this,offset_in_session_impl_to_subr f,
          strong_typedef<int,_libtorrent::port_mapping_tag,_void> *a)

{
  io_context *ctx;
  uint *in_RCX;
  shared_ptr<libtorrent::aux::session_impl> s;
  __shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> local_60;
  undefined1 local_50 [32];
  bitfield_flag<unsigned_int,_libtorrent::status_flags_tag,_void> local_30;
  
  ::std::__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_60,this);
  if (local_60._M_ptr != (element_type *)0x0) {
    ctx = (local_60._M_ptr)->m_io_context;
    ::std::__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> *)local_50,
               &local_60);
    local_30.m_val = *in_RCX;
    local_50._16_8_ = f;
    local_50._24_8_ = a;
    boost::asio::
    dispatch<boost::asio::io_context,libtorrent::session_handle::async_call<void(libtorrent::aux::session_impl::*)(libtorrent::aux::strong_typedef<int,libtorrent::port_mapping_tag,void>),libtorrent::aux::strong_typedef<int,libtorrent::port_mapping_tag,void>&>(void(libtorrent::aux::session_impl::*)(libtorrent::aux::strong_typedef<int,libtorrent::port_mapping_tag,void>),libtorrent::aux::strong_typedef<int,libtorrent::port_mapping_tag,void>&)const::_lambda()_1_>
              (ctx,(type *)local_50,(type *)0x0);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    return;
  }
  local_50._0_4_ = invalid_session_handle;
  aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
            ((error_code_enum *)local_50);
}

Assistant:

void session_handle::async_call(Fun f, Args&&... a) const
	{
		std::shared_ptr<session_impl> s = m_impl.lock();
		if (!s) aux::throw_ex<system_error>(errors::invalid_session_handle);
		dispatch(s->get_context(), [=]() mutable
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				(s.get()->*f)(std::forward<Args>(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (system_error const& e) {
				s->alerts().emplace_alert<session_error_alert>(e.code(), e.what());
			} catch (std::exception const& e) {
				s->alerts().emplace_alert<session_error_alert>(error_code(), e.what());
			} catch (...) {
				s->alerts().emplace_alert<session_error_alert>(error_code(), "unknown error");
			}
#endif
		});
	}